

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O3

uint64_t duckdb::NumericRangeInfo::ListLength
                   (int64_t start_value,int64_t end_value,int64_t increment_value,
                   bool inclusive_bound)

{
  hugeint_t a;
  hugeint_t a_00;
  hugeint_t hVar1;
  char cVar2;
  InvalidInputException *this;
  undefined1 auVar3 [16];
  hugeint_t total_values;
  unsigned_long result;
  hugeint_t increment;
  hugeint_t total_diff;
  uint64_t in_stack_ffffffffffffff58;
  uint64_t in_stack_ffffffffffffff60;
  uint64_t uVar4;
  hugeint_t local_90;
  undefined1 local_80 [16];
  hugeint_t local_70;
  hugeint_t local_60;
  hugeint_t local_50;
  hugeint_t local_40;
  
  if (((increment_value == 0) || (end_value < start_value && 0 < increment_value)) ||
     (start_value < end_value && increment_value < 0)) {
    local_90.lower = 0;
  }
  else {
    duckdb::hugeint_t::hugeint_t(&local_90,end_value);
    duckdb::hugeint_t::hugeint_t(&local_70,start_value);
    duckdb::hugeint_t::operator-(&local_90,&local_70);
    a.upper = in_stack_ffffffffffffff60;
    a.lower = in_stack_ffffffffffffff58;
    local_40 = AbsValue<duckdb::hugeint_t>(a);
    duckdb::hugeint_t::hugeint_t(&local_50,increment_value);
    a_00.upper = in_stack_ffffffffffffff60;
    a_00.lower = in_stack_ffffffffffffff58;
    local_70 = AbsValue<duckdb::hugeint_t>(a_00);
    auVar3 = duckdb::hugeint_t::operator/(&local_40,&local_70);
    uVar4 = auVar3._0_8_;
    local_90 = (hugeint_t)duckdb::hugeint_t::operator%(&local_40,&local_70);
    duckdb::hugeint_t::hugeint_t(&local_60,0);
    cVar2 = duckdb::hugeint_t::operator==(&local_90,&local_60);
    if ((cVar2 == '\0') || (inclusive_bound)) {
      duckdb::hugeint_t::hugeint_t(&local_90,1);
      duckdb::hugeint_t::operator+=((hugeint_t *)&stack0xffffffffffffff60,&local_90);
    }
    duckdb::hugeint_t::hugeint_t(&local_90,0xffffffff);
    cVar2 = duckdb::hugeint_t::operator>((hugeint_t *)&stack0xffffffffffffff60,&local_90);
    if (cVar2 != '\0') {
      this = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_90.lower = (uint64_t)local_80;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"Lists larger than 2^32 elements are not supported","");
      duckdb::InvalidInputException::InvalidInputException(this,(string *)&local_90);
      __cxa_throw(this,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    hVar1.upper = auVar3._8_8_;
    hVar1.lower = uVar4;
    local_90.lower = 0;
    duckdb::Hugeint::TryCast<unsigned_long>(hVar1,&local_90.lower);
  }
  return local_90.lower;
}

Assistant:

static uint64_t ListLength(int64_t start_value, int64_t end_value, int64_t increment_value, bool inclusive_bound) {
		if (increment_value == 0) {
			return 0;
		}
		if (start_value > end_value && increment_value > 0) {
			return 0;
		}
		if (start_value < end_value && increment_value < 0) {
			return 0;
		}
		hugeint_t total_diff = AbsValue(hugeint_t(end_value) - hugeint_t(start_value));
		hugeint_t increment = AbsValue(hugeint_t(increment_value));
		hugeint_t total_values = total_diff / increment;
		if (total_diff % increment == 0) {
			if (inclusive_bound) {
				total_values += 1;
			}
		} else {
			total_values += 1;
		}
		if (total_values > NumericLimits<uint32_t>::Maximum()) {
			throw InvalidInputException("Lists larger than 2^32 elements are not supported");
		}
		return Hugeint::Cast<uint64_t>(total_values);
	}